

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O3

void __thiscall cmDepends::Clear(cmDepends *this,string *file)

{
  ostream *poVar1;
  cmGeneratedFileStream depFileStream;
  string local_278;
  undefined1 local_258 [584];
  
  if (this->Verbose == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_258,"Clearing dependencies in \"",0x1a);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_258,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\".",2);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout(&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
    std::ios_base::~ios_base((ios_base *)(local_258 + 0x70));
  }
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_258,file,false,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_258,"# Empty dependencies file\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_258,"# This may be replaced when dependencies are built.",0x33);
  std::ios::widen((char)(ostream *)local_258 + (char)*(_func_int **)(local_258._0_8_ + -0x18));
  std::ostream::put((char)local_258);
  std::ostream::flush();
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_258);
  return;
}

Assistant:

void cmDepends::Clear(const std::string& file)
{
  // Print verbose output.
  if (this->Verbose) {
    std::ostringstream msg;
    msg << "Clearing dependencies in \"" << file << "\"." << std::endl;
    cmSystemTools::Stdout(msg.str());
  }

  // Write an empty dependency file.
  cmGeneratedFileStream depFileStream(file);
  depFileStream << "# Empty dependencies file\n"
                << "# This may be replaced when dependencies are built."
                << std::endl;
}